

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  size_t k;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined8 uVar29;
  uint uVar30;
  int iVar31;
  undefined4 uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  ulong uVar39;
  NodeRef *pNVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar66;
  undefined1 in_ZMM0 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [64];
  float fVar165;
  undefined1 auVar166 [16];
  float fVar171;
  undefined1 auVar167 [16];
  float fVar169;
  float fVar170;
  undefined1 auVar168 [64];
  float fVar172;
  float fVar173;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar177 [64];
  float local_38d8;
  float fStack_38d4;
  float fStack_38d0;
  Precalculations pre;
  undefined1 local_3868 [16];
  undefined1 local_3858 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  RTCHitN local_3708 [16];
  undefined1 local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  uint local_3698;
  uint uStack_3694;
  uint uStack_3690;
  uint uStack_368c;
  uint uStack_3688;
  uint uStack_3684;
  uint uStack_3680;
  uint uStack_367c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar159 [64];
  
  auVar14 = mm_lookupmask_ps._240_16_;
  uVar29 = mm_lookupmask_ps._8_8_;
  uVar28 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar110 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar117 = vpcmpeqd_avx(auVar110,(undefined1  [16])valid_i->field_0);
    auVar79 = ZEXT816(0) << 0x40;
    auVar85 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79,5);
    auVar65 = auVar117 & auVar85;
    if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0')
    {
      auVar85 = vandps_avx(auVar85,auVar117);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar156._8_4_ = 0x7fffffff;
      auVar156._0_8_ = 0x7fffffff7fffffff;
      auVar156._12_4_ = 0x7fffffff;
      auVar159 = ZEXT1664(auVar156);
      auVar117 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar148._8_4_ = 0x219392ef;
      auVar148._0_8_ = 0x219392ef219392ef;
      auVar148._12_4_ = 0x219392ef;
      auVar65 = vcmpps_avx(auVar117,auVar148,1);
      auVar160._8_4_ = 0x3f800000;
      auVar160._0_8_ = &DAT_3f8000003f800000;
      auVar160._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar117 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar84 = vcmpps_avx(auVar117,auVar148,1);
      auVar96 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar117 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar117 = vcmpps_avx(auVar117,auVar148,1);
      auVar80 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar149._8_4_ = 0x5d5e0b6b;
      auVar149._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar149._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar95,auVar149,auVar65);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar96,auVar149,auVar84);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar80,auVar149,auVar117)
      ;
      auVar117 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar79,1);
      auVar95._8_4_ = 0x20;
      auVar95._0_8_ = 0x2000000020;
      auVar95._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar117,auVar95);
      auVar117 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar79,5);
      auVar65._8_4_ = 0x40;
      auVar65._0_8_ = 0x4000000040;
      auVar65._12_4_ = 0x40;
      auVar96._8_4_ = 0x60;
      auVar96._0_8_ = 0x6000000060;
      auVar96._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar96,auVar65,auVar117)
      ;
      auVar117 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar79,5);
      auVar84._8_4_ = 0x80;
      auVar84._0_8_ = 0x8000000080;
      auVar84._12_4_ = 0x80;
      auVar80._8_4_ = 0xa0;
      auVar80._0_8_ = 0xa0000000a0;
      auVar80._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar80,auVar84,auVar117)
      ;
      auVar117 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79);
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar164 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar117,auVar85);
      auVar86 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar117,auVar65,auVar85);
      terminated.field_0.i[1] = auVar85._4_4_ ^ auVar110._4_4_;
      terminated.field_0.i[0] = auVar85._0_4_ ^ auVar110._0_4_;
      terminated.field_0.i[2] = auVar85._8_4_ ^ auVar110._8_4_;
      terminated.field_0.i[3] = auVar85._12_4_ ^ auVar110._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar40 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0062e669:
      paVar38 = paVar38 + -1;
      root.ptr = pNVar40[-1].ptr;
      pNVar40 = pNVar40 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0062f8c0;
      aVar174 = *paVar38;
      auVar110 = vcmpps_avx((undefined1  [16])aVar174,(undefined1  [16])tray.tfar.field_0,1);
      uVar30 = vmovmskps_avx(auVar110);
      if (uVar30 == 0) {
LAB_0062f8d1:
        iVar31 = 2;
      }
      else {
        uVar39 = (ulong)(uVar30 & 0xff);
        uVar30 = POPCOUNT(uVar30 & 0xff);
        iVar31 = 0;
        if (uVar30 <= uVar37) {
          do {
            k = 0;
            for (uVar36 = uVar39; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar86 = ZEXT1664(auVar86._0_16_);
            bVar41 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar41) {
              terminated.field_0.i[k] = -1;
            }
            uVar39 = uVar39 - 1 & uVar39;
          } while (uVar39 != 0);
          auVar110 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
          iVar31 = 3;
          auVar159 = ZEXT1664(auVar159._0_16_);
          auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar110[0xf] < '\0') {
            auVar86 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar110._8_4_ = 0xff800000;
            auVar110._0_8_ = 0xff800000ff800000;
            auVar110._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar110,
                               (undefined1  [16])terminated.field_0);
            iVar31 = 2;
          }
        }
        if (uVar37 < uVar30) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0062f8c0;
              auVar110 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar174,6)
              ;
              if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar110[0xf]) goto LAB_0062f8d1;
              uVar39 = (ulong)((uint)root.ptr & 0xf);
              if (uVar39 == 8) {
                auVar110 = vpcmpeqd_avx(auVar86._0_16_,auVar86._0_16_);
                aVar66 = terminated.field_0;
                goto LAB_0062f882;
              }
              auVar79._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar79._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar79._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar34 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar36 = 0;
              auVar110 = auVar159._0_16_;
              goto LAB_0062e8ba;
            }
            auVar177 = ZEXT1664(auVar164._0_16_);
            uVar39 = 0;
            uVar36 = 8;
            do {
              uVar33 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar39 * 8);
              if (uVar33 != 8) {
                uVar32 = *(undefined4 *)(root.ptr + 0x40 + uVar39 * 4);
                auVar42._4_4_ = uVar32;
                auVar42._0_4_ = uVar32;
                auVar42._8_4_ = uVar32;
                auVar42._12_4_ = uVar32;
                auVar20._8_8_ = tray.org.field_0._8_8_;
                auVar20._0_8_ = tray.org.field_0._0_8_;
                auVar21._8_8_ = tray.org.field_0._24_8_;
                auVar21._0_8_ = tray.org.field_0._16_8_;
                auVar22._8_8_ = tray.org.field_0._40_8_;
                auVar22._0_8_ = tray.org.field_0._32_8_;
                auVar110 = vsubps_avx(auVar42,auVar20);
                auVar128._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar110._0_4_;
                auVar128._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar110._4_4_;
                auVar128._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar110._8_4_;
                auVar128._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar110._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x80 + uVar39 * 4);
                auVar43._4_4_ = uVar32;
                auVar43._0_4_ = uVar32;
                auVar43._8_4_ = uVar32;
                auVar43._12_4_ = uVar32;
                auVar110 = vsubps_avx(auVar43,auVar21);
                auVar137._0_4_ = tray.rdir.field_0._16_4_ * auVar110._0_4_;
                auVar137._4_4_ = tray.rdir.field_0._20_4_ * auVar110._4_4_;
                auVar137._8_4_ = tray.rdir.field_0._24_4_ * auVar110._8_4_;
                auVar137._12_4_ = tray.rdir.field_0._28_4_ * auVar110._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xc0 + uVar39 * 4);
                auVar44._4_4_ = uVar32;
                auVar44._0_4_ = uVar32;
                auVar44._8_4_ = uVar32;
                auVar44._12_4_ = uVar32;
                auVar110 = vsubps_avx(auVar44,auVar22);
                auVar150._0_4_ = tray.rdir.field_0._32_4_ * auVar110._0_4_;
                auVar150._4_4_ = tray.rdir.field_0._36_4_ * auVar110._4_4_;
                auVar150._8_4_ = tray.rdir.field_0._40_4_ * auVar110._8_4_;
                auVar150._12_4_ = tray.rdir.field_0._44_4_ * auVar110._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x60 + uVar39 * 4);
                auVar45._4_4_ = uVar32;
                auVar45._0_4_ = uVar32;
                auVar45._8_4_ = uVar32;
                auVar45._12_4_ = uVar32;
                auVar110 = vsubps_avx(auVar45,auVar20);
                auVar67._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar110._0_4_;
                auVar67._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar110._4_4_;
                auVar67._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar110._8_4_;
                auVar67._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar110._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xa0 + uVar39 * 4);
                auVar46._4_4_ = uVar32;
                auVar46._0_4_ = uVar32;
                auVar46._8_4_ = uVar32;
                auVar46._12_4_ = uVar32;
                auVar110 = vsubps_avx(auVar46,auVar21);
                auVar87._0_4_ = tray.rdir.field_0._16_4_ * auVar110._0_4_;
                auVar87._4_4_ = tray.rdir.field_0._20_4_ * auVar110._4_4_;
                auVar87._8_4_ = tray.rdir.field_0._24_4_ * auVar110._8_4_;
                auVar87._12_4_ = tray.rdir.field_0._28_4_ * auVar110._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xe0 + uVar39 * 4);
                auVar47._4_4_ = uVar32;
                auVar47._0_4_ = uVar32;
                auVar47._8_4_ = uVar32;
                auVar47._12_4_ = uVar32;
                auVar110 = vsubps_avx(auVar47,auVar22);
                auVar111._0_4_ = tray.rdir.field_0._32_4_ * auVar110._0_4_;
                auVar111._4_4_ = tray.rdir.field_0._36_4_ * auVar110._4_4_;
                auVar111._8_4_ = tray.rdir.field_0._40_4_ * auVar110._8_4_;
                auVar111._12_4_ = tray.rdir.field_0._44_4_ * auVar110._12_4_;
                auVar110 = vminps_avx(auVar128,auVar67);
                auVar117 = vminps_avx(auVar137,auVar87);
                auVar110 = vmaxps_avx(auVar110,auVar117);
                auVar117 = vminps_avx(auVar150,auVar111);
                auVar110 = vmaxps_avx(auVar110,auVar117);
                auVar48._0_4_ = auVar155._0_4_ * auVar110._0_4_;
                auVar48._4_4_ = auVar155._4_4_ * auVar110._4_4_;
                auVar48._8_4_ = auVar155._8_4_ * auVar110._8_4_;
                auVar48._12_4_ = auVar155._12_4_ * auVar110._12_4_;
                auVar110 = vmaxps_avx(auVar128,auVar67);
                auVar117 = vmaxps_avx(auVar137,auVar87);
                auVar117 = vminps_avx(auVar110,auVar117);
                auVar110 = vmaxps_avx(auVar150,auVar111);
                auVar110 = vminps_avx(auVar117,auVar110);
                auVar68._0_4_ = auVar168._0_4_ * auVar110._0_4_;
                auVar68._4_4_ = auVar168._4_4_ * auVar110._4_4_;
                auVar68._8_4_ = auVar168._8_4_ * auVar110._8_4_;
                auVar68._12_4_ = auVar168._12_4_ * auVar110._12_4_;
                auVar110 = vmaxps_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
                auVar117 = vminps_avx(auVar68,(undefined1  [16])tray.tfar.field_0);
                auVar110 = vcmpps_avx(auVar110,auVar117,2);
                auVar86 = ZEXT1664(auVar110);
                if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar110[0xf] < '\0') {
                  auVar110 = vblendvps_avx(auVar164._0_16_,auVar48,auVar110);
                  if (uVar36 != 8) {
                    pNVar40->ptr = uVar36;
                    pNVar40 = pNVar40 + 1;
                    *paVar38 = auVar177._0_16_;
                    paVar38 = paVar38 + 1;
                  }
                  auVar177 = ZEXT1664(auVar110);
                  uVar36 = uVar33;
                }
              }
              aVar174 = auVar177._0_16_;
            } while ((uVar33 != 8) && (bVar41 = uVar39 < 7, uVar39 = uVar39 + 1, bVar41));
            iVar31 = 0;
            if (uVar36 == 8) {
LAB_0062e857:
              bVar41 = false;
              iVar31 = 4;
            }
            else {
              auVar110 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar174,6)
              ;
              uVar32 = vmovmskps_avx(auVar110);
              bVar41 = true;
              if ((uint)POPCOUNT(uVar32) <= uVar37) {
                pNVar40->ptr = uVar36;
                pNVar40 = pNVar40 + 1;
                *paVar38 = aVar174;
                paVar38 = paVar38 + 1;
                goto LAB_0062e857;
              }
            }
            root.ptr = uVar36;
          } while (bVar41);
        }
      }
      goto LAB_0062f8c3;
    }
  }
  return;
  while( true ) {
    uVar36 = uVar36 + 1;
    lVar34 = lVar34 + 0x60;
    auVar65 = auVar79;
    if (uVar39 - 8 <= uVar36) break;
LAB_0062e8ba:
    pSVar6 = context->scene;
    auVar86 = ZEXT1664(auVar79);
    uVar33 = 0;
    local_3858 = auVar79;
    while( true ) {
      auVar117 = auVar86._0_16_;
      iVar31 = *(int *)(lVar34 + uVar33 * 4);
      if (iVar31 == -1) break;
      uVar30 = *(uint *)(lVar34 + -0x10 + uVar33 * 4);
      pfVar7 = (pSVar6->vertices).items[uVar30];
      uVar35 = (ulong)*(uint *)(lVar34 + -0x50 + uVar33 * 4);
      fVar2 = pfVar7[uVar35];
      auVar49._4_4_ = fVar2;
      auVar49._0_4_ = fVar2;
      auVar49._8_4_ = fVar2;
      auVar49._12_4_ = fVar2;
      fVar2 = pfVar7[uVar35 + 1];
      auVar88._4_4_ = fVar2;
      auVar88._0_4_ = fVar2;
      auVar88._8_4_ = fVar2;
      auVar88._12_4_ = fVar2;
      fVar2 = pfVar7[uVar35 + 2];
      auVar112._4_4_ = fVar2;
      auVar112._0_4_ = fVar2;
      auVar112._8_4_ = fVar2;
      auVar112._12_4_ = fVar2;
      uVar35 = (ulong)*(uint *)(lVar34 + -0x20 + uVar33 * 4);
      fVar2 = pfVar7[uVar35];
      auVar69._4_4_ = fVar2;
      auVar69._0_4_ = fVar2;
      auVar69._8_4_ = fVar2;
      auVar69._12_4_ = fVar2;
      fVar2 = pfVar7[uVar35 + 1];
      auVar129._4_4_ = fVar2;
      auVar129._0_4_ = fVar2;
      auVar129._8_4_ = fVar2;
      auVar129._12_4_ = fVar2;
      fVar2 = pfVar7[uVar35 + 2];
      auVar132._4_4_ = fVar2;
      auVar132._0_4_ = fVar2;
      auVar132._8_4_ = fVar2;
      auVar132._12_4_ = fVar2;
      auVar65 = *(undefined1 (*) [16])ray;
      auVar79 = *(undefined1 (*) [16])(ray + 0x10);
      auVar84 = *(undefined1 (*) [16])(ray + 0x20);
      auVar80 = vsubps_avx(auVar49,auVar65);
      auVar148 = vsubps_avx(auVar88,auVar79);
      auVar149 = vsubps_avx(auVar112,auVar84);
      auVar156 = vsubps_avx(auVar129,auVar79);
      auVar160 = vsubps_avx(auVar132,auVar84);
      auVar49 = vsubps_avx(auVar156,auVar148);
      auVar88 = vsubps_avx(auVar160,auVar149);
      auVar151._0_4_ = auVar156._0_4_ + auVar148._0_4_;
      auVar151._4_4_ = auVar156._4_4_ + auVar148._4_4_;
      auVar151._8_4_ = auVar156._8_4_ + auVar148._8_4_;
      auVar151._12_4_ = auVar156._12_4_ + auVar148._12_4_;
      fVar10 = auVar149._0_4_;
      auVar157._0_4_ = auVar160._0_4_ + fVar10;
      fVar11 = auVar149._4_4_;
      auVar157._4_4_ = auVar160._4_4_ + fVar11;
      fVar12 = auVar149._8_4_;
      auVar157._8_4_ = auVar160._8_4_ + fVar12;
      fVar13 = auVar149._12_4_;
      auVar157._12_4_ = auVar160._12_4_ + fVar13;
      auVar166._0_4_ = auVar151._0_4_ * auVar88._0_4_;
      auVar166._4_4_ = auVar151._4_4_ * auVar88._4_4_;
      auVar166._8_4_ = auVar151._8_4_ * auVar88._8_4_;
      auVar166._12_4_ = auVar151._12_4_ * auVar88._12_4_;
      auVar161 = vfmsub231ps_fma(auVar166,auVar49,auVar157);
      auVar112 = vsubps_avx(auVar69,auVar65);
      auVar166 = vsubps_avx(auVar112,auVar80);
      auVar158._0_4_ = auVar157._0_4_ * auVar166._0_4_;
      auVar158._4_4_ = auVar157._4_4_ * auVar166._4_4_;
      auVar158._8_4_ = auVar157._8_4_ * auVar166._8_4_;
      auVar158._12_4_ = auVar157._12_4_ * auVar166._12_4_;
      auVar175._0_4_ = auVar112._0_4_ + auVar80._0_4_;
      auVar175._4_4_ = auVar112._4_4_ + auVar80._4_4_;
      auVar175._8_4_ = auVar112._8_4_ + auVar80._8_4_;
      auVar175._12_4_ = auVar112._12_4_ + auVar80._12_4_;
      auVar96 = vfmsub231ps_fma(auVar158,auVar88,auVar175);
      auVar176._0_4_ = auVar175._0_4_ * auVar49._0_4_;
      auVar176._4_4_ = auVar175._4_4_ * auVar49._4_4_;
      auVar176._8_4_ = auVar175._8_4_ * auVar49._8_4_;
      auVar176._12_4_ = auVar175._12_4_ * auVar49._12_4_;
      auVar95 = vfmsub231ps_fma(auVar176,auVar166,auVar151);
      fVar3 = *(float *)(ray + 0x60);
      fVar4 = *(float *)(ray + 100);
      fVar19 = *(float *)(ray + 0x68);
      auVar27 = *(undefined1 (*) [12])(ray + 0x60);
      fVar173 = *(float *)(ray + 0x6c);
      auVar152._0_4_ = auVar95._0_4_ * fVar3;
      auVar152._4_4_ = auVar95._4_4_ * fVar4;
      auVar152._8_4_ = auVar95._8_4_ * fVar19;
      auVar152._12_4_ = auVar95._12_4_ * fVar173;
      auVar95 = *(undefined1 (*) [16])(ray + 0x50);
      auVar151 = vfmadd231ps_fma(auVar152,auVar95,auVar96);
      auVar96 = *(undefined1 (*) [16])(ray + 0x40);
      auVar152 = vfmadd231ps_fma(auVar151,auVar96,auVar161);
      uVar35 = (ulong)*(uint *)(lVar34 + -0x40 + uVar33 * 4);
      fVar2 = pfVar7[uVar35];
      auVar70._4_4_ = fVar2;
      auVar70._0_4_ = fVar2;
      auVar70._8_4_ = fVar2;
      auVar70._12_4_ = fVar2;
      auVar65 = vsubps_avx(auVar70,auVar65);
      fVar2 = pfVar7[uVar35 + 1];
      auVar89._4_4_ = fVar2;
      auVar89._0_4_ = fVar2;
      auVar89._8_4_ = fVar2;
      auVar89._12_4_ = fVar2;
      auVar79 = vsubps_avx(auVar89,auVar79);
      fVar2 = pfVar7[uVar35 + 2];
      auVar130._4_4_ = fVar2;
      auVar130._0_4_ = fVar2;
      auVar130._8_4_ = fVar2;
      auVar130._12_4_ = fVar2;
      auVar84 = vsubps_avx(auVar130,auVar84);
      auVar151 = vsubps_avx(auVar148,auVar79);
      auVar149 = vsubps_avx(auVar149,auVar84);
      auVar126._0_4_ = auVar148._0_4_ + auVar79._0_4_;
      auVar126._4_4_ = auVar148._4_4_ + auVar79._4_4_;
      auVar126._8_4_ = auVar148._8_4_ + auVar79._8_4_;
      auVar126._12_4_ = auVar148._12_4_ + auVar79._12_4_;
      auVar141._0_4_ = fVar10 + auVar84._0_4_;
      auVar141._4_4_ = fVar11 + auVar84._4_4_;
      auVar141._8_4_ = fVar12 + auVar84._8_4_;
      auVar141._12_4_ = fVar13 + auVar84._12_4_;
      fVar172 = auVar149._0_4_;
      auVar161._0_4_ = fVar172 * auVar126._0_4_;
      fVar178 = auVar149._4_4_;
      auVar161._4_4_ = fVar178 * auVar126._4_4_;
      fVar179 = auVar149._8_4_;
      auVar161._8_4_ = fVar179 * auVar126._8_4_;
      fVar180 = auVar149._12_4_;
      auVar161._12_4_ = fVar180 * auVar126._12_4_;
      auVar157 = vfmsub231ps_fma(auVar161,auVar151,auVar141);
      auVar161 = vsubps_avx(auVar80,auVar65);
      fVar15 = auVar161._0_4_;
      auVar142._0_4_ = auVar141._0_4_ * fVar15;
      fVar16 = auVar161._4_4_;
      auVar142._4_4_ = auVar141._4_4_ * fVar16;
      fVar17 = auVar161._8_4_;
      auVar142._8_4_ = auVar141._8_4_ * fVar17;
      fVar18 = auVar161._12_4_;
      auVar142._12_4_ = auVar141._12_4_ * fVar18;
      auVar133._0_4_ = auVar80._0_4_ + auVar65._0_4_;
      auVar133._4_4_ = auVar80._4_4_ + auVar65._4_4_;
      auVar133._8_4_ = auVar80._8_4_ + auVar65._8_4_;
      auVar133._12_4_ = auVar80._12_4_ + auVar65._12_4_;
      auVar141 = vfmsub231ps_fma(auVar142,auVar149,auVar133);
      fVar165 = auVar151._0_4_;
      auVar134._0_4_ = fVar165 * auVar133._0_4_;
      fVar169 = auVar151._4_4_;
      auVar134._4_4_ = fVar169 * auVar133._4_4_;
      fVar170 = auVar151._8_4_;
      auVar134._8_4_ = fVar170 * auVar133._8_4_;
      fVar171 = auVar151._12_4_;
      auVar134._12_4_ = fVar171 * auVar133._12_4_;
      auVar50 = vfmsub231ps_fma(auVar134,auVar161,auVar126);
      auVar127._0_4_ = fVar3 * auVar50._0_4_;
      auVar127._4_4_ = fVar4 * auVar50._4_4_;
      auVar127._8_4_ = fVar19 * auVar50._8_4_;
      auVar127._12_4_ = fVar173 * auVar50._12_4_;
      auVar141 = vfmadd231ps_fma(auVar127,auVar95,auVar141);
      auVar157 = vfmadd231ps_fma(auVar141,auVar96,auVar157);
      auVar141 = vsubps_avx(auVar65,auVar112);
      auVar50._0_4_ = auVar65._0_4_ + auVar112._0_4_;
      auVar50._4_4_ = auVar65._4_4_ + auVar112._4_4_;
      auVar50._8_4_ = auVar65._8_4_ + auVar112._8_4_;
      auVar50._12_4_ = auVar65._12_4_ + auVar112._12_4_;
      auVar112 = vsubps_avx(auVar79,auVar156);
      auVar71._0_4_ = auVar156._0_4_ + auVar79._0_4_;
      auVar71._4_4_ = auVar156._4_4_ + auVar79._4_4_;
      auVar71._8_4_ = auVar156._8_4_ + auVar79._8_4_;
      auVar71._12_4_ = auVar156._12_4_ + auVar79._12_4_;
      auVar156 = vsubps_avx(auVar84,auVar160);
      auVar90._0_4_ = auVar84._0_4_ + auVar160._0_4_;
      auVar90._4_4_ = auVar84._4_4_ + auVar160._4_4_;
      auVar90._8_4_ = auVar84._8_4_ + auVar160._8_4_;
      auVar90._12_4_ = auVar84._12_4_ + auVar160._12_4_;
      auVar113._0_4_ = auVar156._0_4_ * auVar71._0_4_;
      auVar113._4_4_ = auVar156._4_4_ * auVar71._4_4_;
      auVar113._8_4_ = auVar156._8_4_ * auVar71._8_4_;
      auVar113._12_4_ = auVar156._12_4_ * auVar71._12_4_;
      auVar79 = vfmsub231ps_fma(auVar113,auVar112,auVar90);
      auVar91._0_4_ = auVar141._0_4_ * auVar90._0_4_;
      auVar91._4_4_ = auVar141._4_4_ * auVar90._4_4_;
      auVar91._8_4_ = auVar141._8_4_ * auVar90._8_4_;
      auVar91._12_4_ = auVar141._12_4_ * auVar90._12_4_;
      auVar65 = vfmsub231ps_fma(auVar91,auVar156,auVar50);
      auVar51._0_4_ = auVar112._0_4_ * auVar50._0_4_;
      auVar51._4_4_ = auVar112._4_4_ * auVar50._4_4_;
      auVar51._8_4_ = auVar112._8_4_ * auVar50._8_4_;
      auVar51._12_4_ = auVar112._12_4_ * auVar50._12_4_;
      auVar84 = vfmsub231ps_fma(auVar51,auVar141,auVar71);
      auVar52._0_4_ = fVar3 * auVar84._0_4_;
      auVar52._4_4_ = fVar4 * auVar84._4_4_;
      auVar52._8_4_ = fVar19 * auVar84._8_4_;
      auVar52._12_4_ = fVar173 * auVar84._12_4_;
      auVar65 = vfmadd231ps_fma(auVar52,auVar95,auVar65);
      auVar160 = vfmadd231ps_fma(auVar65,auVar96,auVar79);
      auVar131._0_4_ = auVar160._0_4_ + auVar152._0_4_ + auVar157._0_4_;
      auVar131._4_4_ = auVar160._4_4_ + auVar152._4_4_ + auVar157._4_4_;
      auVar131._8_4_ = auVar160._8_4_ + auVar152._8_4_ + auVar157._8_4_;
      auVar131._12_4_ = auVar160._12_4_ + auVar152._12_4_ + auVar157._12_4_;
      auVar65 = vminps_avx(auVar152,auVar157);
      auVar79 = vminps_avx(auVar65,auVar160);
      auVar65 = vandps_avx(auVar131,auVar110);
      auVar92._0_4_ = auVar65._0_4_ * 1.1920929e-07;
      auVar92._4_4_ = auVar65._4_4_ * 1.1920929e-07;
      auVar92._8_4_ = auVar65._8_4_ * 1.1920929e-07;
      auVar92._12_4_ = auVar65._12_4_ * 1.1920929e-07;
      uVar35 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
      auVar114._0_8_ = uVar35 ^ 0x8000000080000000;
      auVar114._8_4_ = -auVar92._8_4_;
      auVar114._12_4_ = -auVar92._12_4_;
      auVar79 = vcmpps_avx(auVar79,auVar114,5);
      auVar84 = vmaxps_avx(auVar152,auVar157);
      auVar84 = vmaxps_avx(auVar84,auVar160);
      auVar86 = ZEXT1664(auVar117);
      auVar84 = vcmpps_avx(auVar84,auVar92,2);
      auVar79 = vorps_avx(auVar79,auVar84);
      uVar35 = (ulong)*(uint *)(lVar34 + -0x30 + uVar33 * 4);
      auVar84 = auVar117 & auVar79;
      fVar2 = pfVar7[uVar35];
      fVar3 = pfVar7[uVar35 + 1];
      fVar4 = pfVar7[uVar35 + 2];
      if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar84[0xf])
      {
        auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar53._0_4_ = fVar165 * auVar88._0_4_;
        auVar53._4_4_ = fVar169 * auVar88._4_4_;
        auVar53._8_4_ = fVar170 * auVar88._8_4_;
        auVar53._12_4_ = fVar171 * auVar88._12_4_;
        auVar72._0_4_ = fVar15 * auVar49._0_4_;
        auVar72._4_4_ = fVar16 * auVar49._4_4_;
        auVar72._8_4_ = fVar17 * auVar49._8_4_;
        auVar72._12_4_ = fVar18 * auVar49._12_4_;
        auVar160 = vfmsub213ps_fma(auVar49,auVar149,auVar53);
        auVar93._0_4_ = auVar112._0_4_ * fVar172;
        auVar93._4_4_ = auVar112._4_4_ * fVar178;
        auVar93._8_4_ = auVar112._8_4_ * fVar179;
        auVar93._12_4_ = auVar112._12_4_ * fVar180;
        auVar115._0_4_ = fVar15 * auVar156._0_4_;
        auVar115._4_4_ = fVar16 * auVar156._4_4_;
        auVar115._8_4_ = fVar17 * auVar156._8_4_;
        auVar115._12_4_ = fVar18 * auVar156._12_4_;
        auVar49 = vfmsub213ps_fma(auVar156,auVar151,auVar93);
        auVar84 = vandps_avx(auVar53,auVar110);
        auVar156 = vandps_avx(auVar93,auVar110);
        auVar84 = vcmpps_avx(auVar84,auVar156,1);
        auVar156 = vblendvps_avx(auVar49,auVar160,auVar84);
        auVar54._0_4_ = auVar141._0_4_ * fVar165;
        auVar54._4_4_ = auVar141._4_4_ * fVar169;
        auVar54._8_4_ = auVar141._8_4_ * fVar170;
        auVar54._12_4_ = auVar141._12_4_ * fVar171;
        auVar160 = vfmsub213ps_fma(auVar141,auVar149,auVar115);
        auVar94._0_4_ = auVar166._0_4_ * fVar172;
        auVar94._4_4_ = auVar166._4_4_ * fVar178;
        auVar94._8_4_ = auVar166._8_4_ * fVar179;
        auVar94._12_4_ = auVar166._12_4_ * fVar180;
        auVar49 = vfmsub213ps_fma(auVar88,auVar161,auVar94);
        auVar84 = vandps_avx(auVar94,auVar110);
        auVar149 = vandps_avx(auVar115,auVar110);
        auVar84 = vcmpps_avx(auVar84,auVar149,1);
        auVar160 = vblendvps_avx(auVar160,auVar49,auVar84);
        auVar49 = vfmsub213ps_fma(auVar166,auVar151,auVar72);
        auVar88 = vfmsub213ps_fma(auVar112,auVar161,auVar54);
        auVar84 = vandps_avx(auVar72,auVar110);
        auVar149 = vandps_avx(auVar54,auVar110);
        auVar84 = vcmpps_avx(auVar84,auVar149,1);
        auVar149 = vblendvps_avx(auVar88,auVar49,auVar84);
        local_38d8 = auVar27._0_4_;
        fStack_38d4 = auVar27._4_4_;
        fStack_38d0 = auVar27._8_4_;
        auVar55._0_4_ = auVar149._0_4_ * local_38d8;
        auVar55._4_4_ = auVar149._4_4_ * fStack_38d4;
        auVar55._8_4_ = auVar149._8_4_ * fStack_38d0;
        auVar55._12_4_ = auVar149._12_4_ * fVar173;
        auVar84 = vfmadd213ps_fma(auVar95,auVar160,auVar55);
        auVar84 = vfmadd213ps_fma(auVar96,auVar156,auVar84);
        auVar56._0_4_ = auVar84._0_4_ + auVar84._0_4_;
        auVar56._4_4_ = auVar84._4_4_ + auVar84._4_4_;
        auVar56._8_4_ = auVar84._8_4_ + auVar84._8_4_;
        auVar56._12_4_ = auVar84._12_4_ + auVar84._12_4_;
        auVar73._0_4_ = auVar149._0_4_ * fVar10;
        auVar73._4_4_ = auVar149._4_4_ * fVar11;
        auVar73._8_4_ = auVar149._8_4_ * fVar12;
        auVar73._12_4_ = auVar149._12_4_ * fVar13;
        auVar84 = vfmadd213ps_fma(auVar148,auVar160,auVar73);
        auVar95 = vfmadd213ps_fma(auVar80,auVar156,auVar84);
        auVar84 = vrcpps_avx(auVar56);
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = &DAT_3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_fma(auVar84,auVar56,auVar143);
        auVar84 = vfmadd132ps_fma(auVar96,auVar84,auVar84);
        auVar74._0_4_ = (auVar95._0_4_ + auVar95._0_4_) * auVar84._0_4_;
        auVar74._4_4_ = (auVar95._4_4_ + auVar95._4_4_) * auVar84._4_4_;
        auVar74._8_4_ = (auVar95._8_4_ + auVar95._8_4_) * auVar84._8_4_;
        auVar74._12_4_ = (auVar95._12_4_ + auVar95._12_4_) * auVar84._12_4_;
        auVar84 = *(undefined1 (*) [16])(ray + 0x80);
        auVar95 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar74,2);
        auVar96 = vcmpps_avx(auVar74,auVar84,2);
        auVar95 = vandps_avx(auVar95,auVar96);
        uVar35 = CONCAT44(auVar56._4_4_,auVar56._0_4_);
        auVar116._0_8_ = uVar35 ^ 0x8000000080000000;
        auVar116._8_4_ = -auVar56._8_4_;
        auVar116._12_4_ = -auVar56._12_4_;
        auVar96 = vcmpps_avx(auVar56,auVar116,4);
        auVar86 = ZEXT1664(auVar117);
        auVar95 = vandps_avx(auVar96,auVar95);
        auVar79 = vandps_avx(auVar117,auVar79);
        auVar95 = vpslld_avx(auVar95,0x1f);
        auVar96 = vpsrad_avx(auVar95,0x1f);
        auVar95 = auVar79 & auVar96;
        if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar95[0xf]
           ) {
          auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar79 = vandps_avx(auVar96,auVar79);
          pGVar8 = (context->scene->geometries).items[uVar30].ptr;
          uVar5 = pGVar8->mask;
          auVar97._4_4_ = uVar5;
          auVar97._0_4_ = uVar5;
          auVar97._8_4_ = uVar5;
          auVar97._12_4_ = uVar5;
          auVar95 = vpand_avx(auVar97,*(undefined1 (*) [16])(ray + 0x90));
          auVar95 = vpcmpeqd_avx(auVar95,_DAT_01feba10);
          auVar80 = auVar79 & ~auVar95;
          auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar96 = vpcmpeqd_avx(auVar161,auVar161);
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar80[0xf] < '\0') {
            auVar79 = vandnps_avx(auVar95,auVar79);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar95 = vrcpps_avx(auVar131);
              auVar123._8_4_ = 0x3f800000;
              auVar123._0_8_ = &DAT_3f8000003f800000;
              auVar123._12_4_ = 0x3f800000;
              auVar80 = vfnmadd213ps_fma(auVar131,auVar95,auVar123);
              auVar95 = vfmadd132ps_fma(auVar80,auVar95,auVar95);
              auVar63._8_4_ = 0x219392ef;
              auVar63._0_8_ = 0x219392ef219392ef;
              auVar63._12_4_ = 0x219392ef;
              auVar65 = vcmpps_avx(auVar65,auVar63,5);
              auVar65 = vandps_avx(auVar95,auVar65);
              auVar124._0_4_ = auVar65._0_4_ * auVar152._0_4_;
              auVar124._4_4_ = auVar65._4_4_ * auVar152._4_4_;
              auVar124._8_4_ = auVar65._8_4_ * auVar152._8_4_;
              auVar124._12_4_ = auVar65._12_4_ * auVar152._12_4_;
              auVar147._8_4_ = 0x3f800000;
              auVar147._0_8_ = &DAT_3f8000003f800000;
              auVar147._12_4_ = 0x3f800000;
              auVar95 = vminps_avx(auVar124,auVar147);
              auVar64._0_4_ = auVar157._0_4_ * auVar65._0_4_;
              auVar64._4_4_ = auVar157._4_4_ * auVar65._4_4_;
              auVar64._8_4_ = auVar157._8_4_ * auVar65._8_4_;
              auVar64._12_4_ = auVar157._12_4_ * auVar65._12_4_;
              auVar65 = vminps_avx(auVar64,auVar147);
              auVar80 = vsubps_avx(auVar147,auVar95);
              auVar148 = vsubps_avx(auVar147,auVar65);
              auVar23._8_8_ = uVar29;
              auVar23._0_8_ = uVar28;
              local_36d8 = vblendvps_avx(auVar95,auVar80,auVar23);
              local_36c8 = vblendvps_avx(auVar65,auVar148,auVar23);
              local_36a8._4_4_ = uVar30;
              local_36a8._0_4_ = uVar30;
              local_36a8._8_4_ = uVar30;
              local_36a8._12_4_ = uVar30;
              local_36b8._4_4_ = iVar31;
              local_36b8._0_4_ = iVar31;
              local_36b8._8_4_ = iVar31;
              local_36b8._12_4_ = iVar31;
              vpcmpeqd_avx2(ZEXT1632(local_36c8),ZEXT1632(local_36c8));
              uStack_3694 = context->user->instID[0];
              local_3698 = uStack_3694;
              uStack_3690 = uStack_3694;
              uStack_368c = uStack_3694;
              uStack_3688 = context->user->instPrimID[0];
              uStack_3684 = uStack_3688;
              uStack_3680 = uStack_3688;
              uStack_367c = uStack_3688;
              auVar65 = vblendvps_avx(auVar84,auVar74,auVar79);
              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
              args.valid = (int *)local_3868;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_3708;
              args.N = 4;
              local_3868 = auVar79;
              args.ray = (RTCRayN *)ray;
              local_3708 = (RTCHitN  [16])auVar156;
              local_36f8 = auVar160;
              local_36e8 = auVar149;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->occlusionFilterN)(&args);
                auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_3868 == (undefined1  [16])0x0) {
                auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar96 = auVar96 ^ auVar65;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var9)(&args);
                  auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                  auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,local_3868);
                auVar96 = auVar96 ^ auVar65;
                auVar107._8_4_ = 0xff800000;
                auVar107._0_8_ = 0xff800000ff800000;
                auVar107._12_4_ = 0xff800000;
                auVar65 = vblendvps_avx(auVar107,*(undefined1 (*) [16])(args.ray + 0x80),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar65;
              }
              auVar65 = vpslld_avx(auVar96,0x1f);
              auVar79 = vpsrad_avx(auVar65,0x1f);
              auVar65 = vblendvps_avx(auVar84,*(undefined1 (*) [16])pRVar1,auVar65);
              *(undefined1 (*) [16])pRVar1 = auVar65;
            }
            auVar117 = vpandn_avx(auVar79,auVar117);
            auVar86 = ZEXT1664(auVar117);
          }
        }
      }
      auVar117 = auVar86._0_16_;
      if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar86[0xf])
      {
        bVar41 = false;
      }
      else {
        auVar65 = *(undefined1 (*) [16])ray;
        auVar79 = *(undefined1 (*) [16])(ray + 0x10);
        auVar84 = *(undefined1 (*) [16])(ray + 0x20);
        auVar26._4_4_ = fVar2;
        auVar26._0_4_ = fVar2;
        auVar26._8_4_ = fVar2;
        auVar26._12_4_ = fVar2;
        auVar80 = vsubps_avx(auVar26,auVar65);
        auVar25._4_4_ = fVar3;
        auVar25._0_4_ = fVar3;
        auVar25._8_4_ = fVar3;
        auVar25._12_4_ = fVar3;
        auVar148 = vsubps_avx(auVar25,auVar79);
        auVar24._4_4_ = fVar4;
        auVar24._0_4_ = fVar4;
        auVar24._8_4_ = fVar4;
        auVar24._12_4_ = fVar4;
        auVar95 = vsubps_avx(auVar24,auVar84);
        auVar96 = vsubps_avx(auVar69,auVar65);
        auVar149 = vsubps_avx(auVar129,auVar79);
        auVar156 = vsubps_avx(auVar132,auVar84);
        auVar160 = vsubps_avx(auVar70,auVar65);
        auVar49 = vsubps_avx(auVar89,auVar79);
        auVar84 = vsubps_avx(auVar130,auVar84);
        auVar88 = vsubps_avx(auVar160,auVar80);
        auVar112 = vsubps_avx(auVar49,auVar148);
        auVar166 = vsubps_avx(auVar84,auVar95);
        auVar144._0_4_ = auVar160._0_4_ + auVar80._0_4_;
        auVar144._4_4_ = auVar160._4_4_ + auVar80._4_4_;
        auVar144._8_4_ = auVar160._8_4_ + auVar80._8_4_;
        auVar144._12_4_ = auVar160._12_4_ + auVar80._12_4_;
        auVar154._0_4_ = auVar148._0_4_ + auVar49._0_4_;
        auVar154._4_4_ = auVar148._4_4_ + auVar49._4_4_;
        auVar154._8_4_ = auVar148._8_4_ + auVar49._8_4_;
        auVar154._12_4_ = auVar148._12_4_ + auVar49._12_4_;
        fVar171 = auVar95._0_4_;
        auVar162._0_4_ = fVar171 + auVar84._0_4_;
        fVar172 = auVar95._4_4_;
        auVar162._4_4_ = fVar172 + auVar84._4_4_;
        fVar178 = auVar95._8_4_;
        auVar162._8_4_ = fVar178 + auVar84._8_4_;
        fVar179 = auVar95._12_4_;
        auVar162._12_4_ = fVar179 + auVar84._12_4_;
        auVar167._0_4_ = auVar154._0_4_ * auVar166._0_4_;
        auVar167._4_4_ = auVar154._4_4_ * auVar166._4_4_;
        auVar167._8_4_ = auVar154._8_4_ * auVar166._8_4_;
        auVar167._12_4_ = auVar154._12_4_ * auVar166._12_4_;
        auVar161 = vfmsub231ps_fma(auVar167,auVar112,auVar162);
        auVar163._0_4_ = auVar162._0_4_ * auVar88._0_4_;
        auVar163._4_4_ = auVar162._4_4_ * auVar88._4_4_;
        auVar163._8_4_ = auVar162._8_4_ * auVar88._8_4_;
        auVar163._12_4_ = auVar162._12_4_ * auVar88._12_4_;
        auVar79 = vfmsub231ps_fma(auVar163,auVar166,auVar144);
        auVar145._0_4_ = auVar144._0_4_ * auVar112._0_4_;
        auVar145._4_4_ = auVar144._4_4_ * auVar112._4_4_;
        auVar145._8_4_ = auVar144._8_4_ * auVar112._8_4_;
        auVar145._12_4_ = auVar144._12_4_ * auVar112._12_4_;
        auVar65 = vfmsub231ps_fma(auVar145,auVar88,auVar154);
        fVar16 = *(float *)(ray + 0x60);
        fVar17 = *(float *)(ray + 100);
        fVar18 = *(float *)(ray + 0x68);
        auVar27 = *(undefined1 (*) [12])(ray + 0x60);
        fVar19 = *(float *)(ray + 0x6c);
        auVar153._0_4_ = auVar65._0_4_ * fVar16;
        auVar153._4_4_ = auVar65._4_4_ * fVar17;
        auVar153._8_4_ = auVar65._8_4_ * fVar18;
        auVar153._12_4_ = auVar65._12_4_ * fVar19;
        auVar65 = *(undefined1 (*) [16])(ray + 0x50);
        auVar151 = vfmadd231ps_fma(auVar153,auVar65,auVar79);
        auVar79 = *(undefined1 (*) [16])(ray + 0x40);
        auVar157 = vfmadd231ps_fma(auVar151,auVar79,auVar161);
        auVar151 = vsubps_avx(auVar148,auVar149);
        auVar161 = vsubps_avx(auVar95,auVar156);
        auVar146._0_4_ = auVar148._0_4_ + auVar149._0_4_;
        auVar146._4_4_ = auVar148._4_4_ + auVar149._4_4_;
        auVar146._8_4_ = auVar148._8_4_ + auVar149._8_4_;
        auVar146._12_4_ = auVar148._12_4_ + auVar149._12_4_;
        auVar98._0_4_ = fVar171 + auVar156._0_4_;
        auVar98._4_4_ = fVar172 + auVar156._4_4_;
        auVar98._8_4_ = fVar178 + auVar156._8_4_;
        auVar98._12_4_ = fVar179 + auVar156._12_4_;
        fVar2 = auVar161._0_4_;
        auVar118._0_4_ = auVar146._0_4_ * fVar2;
        fVar4 = auVar161._4_4_;
        auVar118._4_4_ = auVar146._4_4_ * fVar4;
        fVar11 = auVar161._8_4_;
        auVar118._8_4_ = auVar146._8_4_ * fVar11;
        fVar13 = auVar161._12_4_;
        auVar118._12_4_ = auVar146._12_4_ * fVar13;
        auVar152 = vfmsub231ps_fma(auVar118,auVar151,auVar98);
        auVar141 = vsubps_avx(auVar80,auVar96);
        fVar173 = auVar141._0_4_;
        auVar99._0_4_ = fVar173 * auVar98._0_4_;
        fVar165 = auVar141._4_4_;
        auVar99._4_4_ = fVar165 * auVar98._4_4_;
        fVar169 = auVar141._8_4_;
        auVar99._8_4_ = fVar169 * auVar98._8_4_;
        fVar170 = auVar141._12_4_;
        auVar99._12_4_ = fVar170 * auVar98._12_4_;
        auVar138._0_4_ = auVar96._0_4_ + auVar80._0_4_;
        auVar138._4_4_ = auVar96._4_4_ + auVar80._4_4_;
        auVar138._8_4_ = auVar96._8_4_ + auVar80._8_4_;
        auVar138._12_4_ = auVar96._12_4_ + auVar80._12_4_;
        auVar95 = vfmsub231ps_fma(auVar99,auVar161,auVar138);
        fVar3 = auVar151._0_4_;
        auVar139._0_4_ = auVar138._0_4_ * fVar3;
        fVar10 = auVar151._4_4_;
        auVar139._4_4_ = auVar138._4_4_ * fVar10;
        fVar12 = auVar151._8_4_;
        auVar139._8_4_ = auVar138._8_4_ * fVar12;
        fVar15 = auVar151._12_4_;
        auVar139._12_4_ = auVar138._12_4_ * fVar15;
        auVar50 = vfmsub231ps_fma(auVar139,auVar141,auVar146);
        auVar140._0_4_ = auVar50._0_4_ * fVar16;
        auVar140._4_4_ = auVar50._4_4_ * fVar17;
        auVar140._8_4_ = auVar50._8_4_ * fVar18;
        auVar140._12_4_ = auVar50._12_4_ * fVar19;
        auVar95 = vfmadd231ps_fma(auVar140,auVar65,auVar95);
        auVar50 = vfmadd231ps_fma(auVar95,auVar79,auVar152);
        auVar152 = vsubps_avx(auVar96,auVar160);
        auVar100._0_4_ = auVar96._0_4_ + auVar160._0_4_;
        auVar100._4_4_ = auVar96._4_4_ + auVar160._4_4_;
        auVar100._8_4_ = auVar96._8_4_ + auVar160._8_4_;
        auVar100._12_4_ = auVar96._12_4_ + auVar160._12_4_;
        auVar160 = vsubps_avx(auVar149,auVar49);
        auVar75._0_4_ = auVar149._0_4_ + auVar49._0_4_;
        auVar75._4_4_ = auVar149._4_4_ + auVar49._4_4_;
        auVar75._8_4_ = auVar149._8_4_ + auVar49._8_4_;
        auVar75._12_4_ = auVar149._12_4_ + auVar49._12_4_;
        auVar149 = vsubps_avx(auVar156,auVar84);
        auVar57._0_4_ = auVar156._0_4_ + auVar84._0_4_;
        auVar57._4_4_ = auVar156._4_4_ + auVar84._4_4_;
        auVar57._8_4_ = auVar156._8_4_ + auVar84._8_4_;
        auVar57._12_4_ = auVar156._12_4_ + auVar84._12_4_;
        auVar119._0_4_ = auVar149._0_4_ * auVar75._0_4_;
        auVar119._4_4_ = auVar149._4_4_ * auVar75._4_4_;
        auVar119._8_4_ = auVar149._8_4_ * auVar75._8_4_;
        auVar119._12_4_ = auVar149._12_4_ * auVar75._12_4_;
        auVar95 = vfmsub231ps_fma(auVar119,auVar160,auVar57);
        auVar58._0_4_ = auVar152._0_4_ * auVar57._0_4_;
        auVar58._4_4_ = auVar152._4_4_ * auVar57._4_4_;
        auVar58._8_4_ = auVar152._8_4_ * auVar57._8_4_;
        auVar58._12_4_ = auVar152._12_4_ * auVar57._12_4_;
        auVar84 = vfmsub231ps_fma(auVar58,auVar149,auVar100);
        auVar101._0_4_ = auVar100._0_4_ * auVar160._0_4_;
        auVar101._4_4_ = auVar100._4_4_ * auVar160._4_4_;
        auVar101._8_4_ = auVar100._8_4_ * auVar160._8_4_;
        auVar101._12_4_ = auVar100._12_4_ * auVar160._12_4_;
        auVar96 = vfmsub231ps_fma(auVar101,auVar152,auVar75);
        auVar76._0_4_ = auVar96._0_4_ * fVar16;
        auVar76._4_4_ = auVar96._4_4_ * fVar17;
        auVar76._8_4_ = auVar96._8_4_ * fVar18;
        auVar76._12_4_ = auVar96._12_4_ * fVar19;
        auVar84 = vfmadd231ps_fma(auVar76,auVar65,auVar84);
        auVar156 = vfmadd231ps_fma(auVar84,auVar79,auVar95);
        auVar102._0_4_ = auVar156._0_4_ + auVar157._0_4_ + auVar50._0_4_;
        auVar102._4_4_ = auVar156._4_4_ + auVar157._4_4_ + auVar50._4_4_;
        auVar102._8_4_ = auVar156._8_4_ + auVar157._8_4_ + auVar50._8_4_;
        auVar102._12_4_ = auVar156._12_4_ + auVar157._12_4_ + auVar50._12_4_;
        auVar84 = vminps_avx(auVar157,auVar50);
        auVar95 = vminps_avx(auVar84,auVar156);
        auVar84 = vandps_avx(auVar102,auVar110);
        auVar103._0_4_ = auVar84._0_4_ * 1.1920929e-07;
        auVar103._4_4_ = auVar84._4_4_ * 1.1920929e-07;
        auVar103._8_4_ = auVar84._8_4_ * 1.1920929e-07;
        auVar103._12_4_ = auVar84._12_4_ * 1.1920929e-07;
        uVar35 = CONCAT44(auVar103._4_4_,auVar103._0_4_);
        auVar120._0_8_ = uVar35 ^ 0x8000000080000000;
        auVar120._8_4_ = -auVar103._8_4_;
        auVar120._12_4_ = -auVar103._12_4_;
        auVar95 = vcmpps_avx(auVar95,auVar120,5);
        auVar96 = vmaxps_avx(auVar157,auVar50);
        auVar96 = vmaxps_avx(auVar96,auVar156);
        auVar96 = vcmpps_avx(auVar96,auVar103,2);
        auVar95 = vorps_avx(auVar95,auVar96);
        auVar96 = auVar117 & auVar95;
        if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar96[0xf]
           ) {
LAB_0062f7f7:
          auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar59._0_4_ = fVar3 * auVar166._0_4_;
          auVar59._4_4_ = fVar10 * auVar166._4_4_;
          auVar59._8_4_ = fVar12 * auVar166._8_4_;
          auVar59._12_4_ = fVar15 * auVar166._12_4_;
          auVar77._0_4_ = fVar173 * auVar112._0_4_;
          auVar77._4_4_ = fVar165 * auVar112._4_4_;
          auVar77._8_4_ = fVar169 * auVar112._8_4_;
          auVar77._12_4_ = fVar170 * auVar112._12_4_;
          auVar156 = vfmsub213ps_fma(auVar112,auVar161,auVar59);
          auVar104._0_4_ = fVar2 * auVar160._0_4_;
          auVar104._4_4_ = fVar4 * auVar160._4_4_;
          auVar104._8_4_ = fVar11 * auVar160._8_4_;
          auVar104._12_4_ = fVar13 * auVar160._12_4_;
          auVar121._0_4_ = fVar173 * auVar149._0_4_;
          auVar121._4_4_ = fVar165 * auVar149._4_4_;
          auVar121._8_4_ = fVar169 * auVar149._8_4_;
          auVar121._12_4_ = fVar170 * auVar149._12_4_;
          auVar49 = vfmsub213ps_fma(auVar149,auVar151,auVar104);
          auVar96 = vandps_avx(auVar59,auVar110);
          auVar149 = vandps_avx(auVar104,auVar110);
          auVar96 = vcmpps_avx(auVar96,auVar149,1);
          auVar156 = vblendvps_avx(auVar49,auVar156,auVar96);
          auVar60._0_4_ = auVar152._0_4_ * fVar3;
          auVar60._4_4_ = auVar152._4_4_ * fVar10;
          auVar60._8_4_ = auVar152._8_4_ * fVar12;
          auVar60._12_4_ = auVar152._12_4_ * fVar15;
          auVar49 = vfmsub213ps_fma(auVar152,auVar161,auVar121);
          auVar105._0_4_ = fVar2 * auVar88._0_4_;
          auVar105._4_4_ = fVar4 * auVar88._4_4_;
          auVar105._8_4_ = fVar11 * auVar88._8_4_;
          auVar105._12_4_ = fVar13 * auVar88._12_4_;
          auVar112 = vfmsub213ps_fma(auVar166,auVar141,auVar105);
          auVar96 = vandps_avx(auVar105,auVar110);
          auVar149 = vandps_avx(auVar121,auVar110);
          auVar96 = vcmpps_avx(auVar96,auVar149,1);
          auVar49 = vblendvps_avx(auVar49,auVar112,auVar96);
          auVar88 = vfmsub213ps_fma(auVar88,auVar151,auVar77);
          auVar160 = vfmsub213ps_fma(auVar160,auVar141,auVar60);
          auVar96 = vandps_avx(auVar77,auVar110);
          auVar149 = vandps_avx(auVar60,auVar110);
          auVar96 = vcmpps_avx(auVar96,auVar149,1);
          auVar96 = vblendvps_avx(auVar160,auVar88,auVar96);
          local_38d8 = auVar27._0_4_;
          fStack_38d4 = auVar27._4_4_;
          fStack_38d0 = auVar27._8_4_;
          auVar61._0_4_ = auVar96._0_4_ * local_38d8;
          auVar61._4_4_ = auVar96._4_4_ * fStack_38d4;
          auVar61._8_4_ = auVar96._8_4_ * fStack_38d0;
          auVar61._12_4_ = auVar96._12_4_ * fVar19;
          auVar65 = vfmadd213ps_fma(auVar65,auVar49,auVar61);
          auVar65 = vfmadd213ps_fma(auVar79,auVar156,auVar65);
          auVar62._0_4_ = auVar65._0_4_ + auVar65._0_4_;
          auVar62._4_4_ = auVar65._4_4_ + auVar65._4_4_;
          auVar62._8_4_ = auVar65._8_4_ + auVar65._8_4_;
          auVar62._12_4_ = auVar65._12_4_ + auVar65._12_4_;
          auVar78._0_4_ = auVar96._0_4_ * fVar171;
          auVar78._4_4_ = auVar96._4_4_ * fVar172;
          auVar78._8_4_ = auVar96._8_4_ * fVar178;
          auVar78._12_4_ = auVar96._12_4_ * fVar179;
          auVar65 = vfmadd213ps_fma(auVar148,auVar49,auVar78);
          auVar79 = vfmadd213ps_fma(auVar80,auVar156,auVar65);
          auVar65 = vrcpps_avx(auVar62);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = &DAT_3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar80 = vfnmadd213ps_fma(auVar65,auVar62,auVar135);
          auVar65 = vfmadd132ps_fma(auVar80,auVar65,auVar65);
          auVar106._0_4_ = (auVar79._0_4_ + auVar79._0_4_) * auVar65._0_4_;
          auVar106._4_4_ = (auVar79._4_4_ + auVar79._4_4_) * auVar65._4_4_;
          auVar106._8_4_ = (auVar79._8_4_ + auVar79._8_4_) * auVar65._8_4_;
          auVar106._12_4_ = (auVar79._12_4_ + auVar79._12_4_) * auVar65._12_4_;
          auVar65 = *(undefined1 (*) [16])(ray + 0x80);
          auVar79 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar106,2);
          auVar80 = vcmpps_avx(auVar106,auVar65,2);
          auVar79 = vandps_avx(auVar79,auVar80);
          uVar35 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
          auVar122._0_8_ = uVar35 ^ 0x8000000080000000;
          auVar122._8_4_ = -auVar62._8_4_;
          auVar122._12_4_ = -auVar62._12_4_;
          auVar80 = vcmpps_avx(auVar62,auVar122,4);
          auVar79 = vandps_avx(auVar80,auVar79);
          auVar95 = vandps_avx(auVar95,auVar117);
          auVar79 = vpslld_avx(auVar79,0x1f);
          auVar80 = vpsrad_avx(auVar79,0x1f);
          auVar79 = auVar95 & auVar80;
          if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar79[0xf]) goto LAB_0062f7f7;
          auVar79 = vandps_avx(auVar80,auVar95);
          uVar5 = *(uint *)(lVar34 + -0x10 + uVar33 * 4);
          pGVar8 = (context->scene->geometries).items[uVar5].ptr;
          uVar30 = pGVar8->mask;
          auVar81._4_4_ = uVar30;
          auVar81._0_4_ = uVar30;
          auVar81._8_4_ = uVar30;
          auVar81._12_4_ = uVar30;
          auVar95 = vpand_avx(auVar81,*(undefined1 (*) [16])(ray + 0x90));
          auVar95 = vpcmpeqd_avx(auVar95,_DAT_01feba10);
          auVar80 = auVar79 & ~auVar95;
          auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar80[0xf] < '\0') {
            uVar32 = *(undefined4 *)(lVar34 + uVar33 * 4);
            auVar79 = vandnps_avx(auVar95,auVar79);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar95 = vrcpps_avx(auVar102);
              auVar136._8_4_ = 0x3f800000;
              auVar136._0_8_ = &DAT_3f8000003f800000;
              auVar136._12_4_ = 0x3f800000;
              auVar80 = vfnmadd213ps_fma(auVar102,auVar95,auVar136);
              auVar95 = vfmadd132ps_fma(auVar80,auVar95,auVar95);
              auVar82._8_4_ = 0x219392ef;
              auVar82._0_8_ = 0x219392ef219392ef;
              auVar82._12_4_ = 0x219392ef;
              auVar84 = vcmpps_avx(auVar84,auVar82,5);
              auVar84 = vandps_avx(auVar84,auVar95);
              auVar125._0_4_ = auVar84._0_4_ * auVar157._0_4_;
              auVar125._4_4_ = auVar84._4_4_ * auVar157._4_4_;
              auVar125._8_4_ = auVar84._8_4_ * auVar157._8_4_;
              auVar125._12_4_ = auVar84._12_4_ * auVar157._12_4_;
              auVar95 = vminps_avx(auVar125,auVar136);
              auVar83._0_4_ = auVar84._0_4_ * auVar50._0_4_;
              auVar83._4_4_ = auVar84._4_4_ * auVar50._4_4_;
              auVar83._8_4_ = auVar84._8_4_ * auVar50._8_4_;
              auVar83._12_4_ = auVar84._12_4_ * auVar50._12_4_;
              auVar84 = vminps_avx(auVar83,auVar136);
              auVar80 = vsubps_avx(auVar136,auVar95);
              auVar148 = vsubps_avx(auVar136,auVar84);
              local_36d8 = vblendvps_avx(auVar95,auVar80,auVar14);
              local_36c8 = vblendvps_avx(auVar84,auVar148,auVar14);
              local_36a8._4_4_ = uVar5;
              local_36a8._0_4_ = uVar5;
              local_36a8._8_4_ = uVar5;
              local_36a8._12_4_ = uVar5;
              local_36b8._4_4_ = uVar32;
              local_36b8._0_4_ = uVar32;
              local_36b8._8_4_ = uVar32;
              local_36b8._12_4_ = uVar32;
              vpcmpeqd_avx2(ZEXT1632(local_36c8),ZEXT1632(local_36c8));
              uStack_3694 = context->user->instID[0];
              local_3698 = uStack_3694;
              uStack_3690 = uStack_3694;
              uStack_368c = uStack_3694;
              uStack_3688 = context->user->instPrimID[0];
              uStack_3684 = uStack_3688;
              uStack_3680 = uStack_3688;
              uStack_367c = uStack_3688;
              auVar84 = vblendvps_avx(auVar65,auVar106,auVar79);
              *(undefined1 (*) [16])(ray + 0x80) = auVar84;
              args.valid = (int *)local_3868;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_3708;
              args.N = 4;
              local_3868 = auVar79;
              args.ray = (RTCRayN *)ray;
              local_3708 = (RTCHitN  [16])auVar156;
              local_36f8 = auVar49;
              local_36e8 = auVar96;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->occlusionFilterN)(&args);
                auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_3868 == (undefined1  [16])0x0) {
                auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar79 = auVar79 ^ _DAT_01febe20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var9)(&args);
                  auVar168 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar155 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar164 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,local_3868);
                auVar79 = auVar84 ^ _DAT_01febe20;
                auVar108._8_4_ = 0xff800000;
                auVar108._0_8_ = 0xff800000ff800000;
                auVar108._12_4_ = 0xff800000;
                auVar84 = vblendvps_avx(auVar108,*(undefined1 (*) [16])(args.ray + 0x80),auVar84);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar84;
              }
              auVar84 = vpslld_avx(auVar79,0x1f);
              auVar79 = vpsrad_avx(auVar84,0x1f);
              auVar65 = vblendvps_avx(auVar65,*(undefined1 (*) [16])pRVar1,auVar84);
              *(undefined1 (*) [16])pRVar1 = auVar65;
            }
            auVar117 = vpandn_avx(auVar79,auVar117);
          }
        }
        auVar86 = ZEXT1664(auVar117);
        bVar41 = (((auVar117 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar117 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar117 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar117[0xf] < '\0';
      }
      auVar159 = ZEXT1664(auVar110);
      auVar117 = auVar86._0_16_;
      if ((!bVar41) || (bVar41 = 2 < uVar33, uVar33 = uVar33 + 1, bVar41)) break;
    }
    auVar79 = vandps_avx(auVar117,local_3858);
    auVar117 = local_3858 & auVar117;
    auVar65 = local_3858;
    if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar117[0xf])
    break;
  }
  auVar110 = vpcmpeqd_avx(auVar65,auVar65);
  aVar66._0_4_ = auVar79._0_4_ ^ auVar110._0_4_;
  aVar66._4_4_ = auVar79._4_4_ ^ auVar110._4_4_;
  aVar66._8_4_ = auVar79._8_4_ ^ auVar110._8_4_;
  aVar66._12_4_ = auVar79._12_4_ ^ auVar110._12_4_;
LAB_0062f882:
  auVar86 = ZEXT1664(auVar110);
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])aVar66,(undefined1  [16])terminated.field_0);
  auVar110 = auVar110 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar110 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar110 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar110[0xf]) {
LAB_0062f8c0:
    iVar31 = 3;
  }
  else {
    auVar86 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
    auVar109._8_4_ = 0xff800000;
    auVar109._0_8_ = 0xff800000ff800000;
    auVar109._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar109,
                       (undefined1  [16])terminated.field_0);
    iVar31 = 0;
  }
LAB_0062f8c3:
  if (iVar31 == 3) {
    auVar14 = vandps_avx(auVar85,(undefined1  [16])terminated.field_0);
    auVar85._8_4_ = 0xff800000;
    auVar85._0_8_ = 0xff800000ff800000;
    auVar85._12_4_ = 0xff800000;
    auVar14 = vmaskmovps_avx(auVar14,auVar85);
    *(undefined1 (*) [16])pRVar1 = auVar14;
    return;
  }
  goto LAB_0062e669;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }